

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O3

EulerAngles *
AML::integrateEulerAngles
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,EulerAngles *angleRates,double dt
          )

{
  double dVar1;
  double dVar2;
  EulerSequence EVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined4 uVar7;
  
  EVar3 = angles->seq_;
  if (EVar3 == angleRates->seq_) {
    dVar1 = angleRates->psi;
    dVar2 = angles->psi;
    dVar5 = dt * angleRates->phi + angles->phi;
    dVar6 = dt * angleRates->theta + angles->theta;
    auVar4._8_4_ = SUB84(dVar6,0);
    auVar4._0_8_ = dVar5;
    auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
    __return_storage_ptr__->phi = dVar5;
    __return_storage_ptr__->theta = (double)auVar4._8_8_;
    __return_storage_ptr__->psi = dVar1 * dt + dVar2;
    __return_storage_ptr__->seq_ = EVar3;
    return __return_storage_ptr__;
  }
  dVar1 = angles->phi;
  dVar2 = angles->theta;
  EVar3 = angles->seq_;
  uVar7 = *(undefined4 *)&angles->field_0x1c;
  __return_storage_ptr__->psi = angles->psi;
  __return_storage_ptr__->seq_ = EVar3;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar7;
  __return_storage_ptr__->phi = dVar1;
  __return_storage_ptr__->theta = dVar2;
  return __return_storage_ptr__;
}

Assistant:

EulerAngles integrateEulerAngles(const EulerAngles& angles, const EulerAngles& angleRates, double dt)
    {
        EulerAngles::EulerSequence seq = angles.getEulerSequence();
        if (seq == angleRates.getEulerSequence())
        {
            double phiNew = angles.phi + angleRates.phi * dt;
            double thetaNew = angles.theta + angleRates.theta * dt;
            double psiNew = angles.psi + angleRates.psi * dt;
            return EulerAngles(phiNew, thetaNew, psiNew, seq);
        }
        return angles;
    }